

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromString(IEEEFloat *this,StringRef str,roundingMode rounding_mode)

{
  bool bVar1;
  StringRef local_b0;
  StringRef local_a0;
  char *local_90;
  size_t slen;
  iterator p;
  roundingMode rounding_mode_local;
  IEEEFloat *this_local;
  StringRef str_local;
  
  str_local.Data = (char *)str.Length;
  this_local = (IEEEFloat *)str.Data;
  if (str_local.Data == (char *)0x0) {
    __assert_fail("!str.empty() && \"Invalid string length\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xa11,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromString(StringRef, roundingMode)"
                 );
  }
  bVar1 = convertFromStringSpecials(this,str);
  if (bVar1) {
    str_local.Length._4_4_ = opOK;
  }
  else {
    slen = (size_t)StringRef::begin((StringRef *)&this_local);
    local_90 = str_local.Data;
    this->field_0x12 = this->field_0x12 & 0xf7 | (*(char *)slen == '-') << 3;
    if ((*(char *)slen == '-') || (*(char *)slen == '+')) {
      slen = slen + 1;
      local_90 = str_local.Data + -1;
      if (local_90 == (char *)0x0) {
        __assert_fail("slen && \"String has no digits\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xa1e,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromString(StringRef, roundingMode)"
                     );
      }
    }
    if (((local_90 < (char *)0x2) || (*(char *)slen != '0')) ||
       ((*(char *)(slen + 1) != 'x' && (*(char *)(slen + 1) != 'X')))) {
      local_b0.Data = (char *)slen;
      local_b0.Length = (size_t)local_90;
      str_local.Length._4_4_ = convertFromDecimalString(this,local_b0,rounding_mode);
    }
    else {
      if (local_90 == (char *)0x2) {
        __assert_fail("slen - 2 && \"Invalid string\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xa22,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromString(StringRef, roundingMode)"
                     );
      }
      local_a0.Data = (char *)(slen + 2);
      local_a0.Length = (size_t)(local_90 + -2);
      str_local.Length._4_4_ = convertFromHexadecimalString(this,local_a0,rounding_mode);
    }
  }
  return str_local.Length._4_4_;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::convertFromString(StringRef str,
                                                 roundingMode rounding_mode) {
  assert(!str.empty() && "Invalid string length");

  // Handle special cases.
  if (convertFromStringSpecials(str))
    return opOK;

  /* Handle a leading minus sign.  */
  StringRef::iterator p = str.begin();
  size_t slen = str.size();
  sign = *p == '-' ? 1 : 0;
  if (*p == '-' || *p == '+') {
    p++;
    slen--;
    assert(slen && "String has no digits");
  }

  if (slen >= 2 && p[0] == '0' && (p[1] == 'x' || p[1] == 'X')) {
    assert(slen - 2 && "Invalid string");
    return convertFromHexadecimalString(StringRef(p + 2, slen - 2),
                                        rounding_mode);
  }

  return convertFromDecimalString(StringRef(p, slen), rounding_mode);
}